

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

RandomUniformStaticLayerParams * __thiscall
CoreML::Specification::RandomUniformStaticLayerParams::New
          (RandomUniformStaticLayerParams *this,Arena *arena)

{
  RandomUniformStaticLayerParams *this_00;
  RandomUniformStaticLayerParams *n;
  Arena *arena_local;
  RandomUniformStaticLayerParams *this_local;
  
  this_00 = (RandomUniformStaticLayerParams *)operator_new(0x40);
  RandomUniformStaticLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::RandomUniformStaticLayerParams>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

RandomUniformStaticLayerParams* RandomUniformStaticLayerParams::New(::google::protobuf::Arena* arena) const {
  RandomUniformStaticLayerParams* n = new RandomUniformStaticLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}